

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_RBIT(DisasContext_conflict1 *s,arg_rr *a)

{
  int reg;
  ulong uVar1;
  TCGContext_conflict1 *s_00;
  TCGTemp *ret;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *args [1];
  TCGTemp *local_38;
  
  uVar1 = s->features;
  if ((uVar1 & 0x40) != 0) {
    s_00 = s->uc->tcg_ctx;
    reg = a->rm;
    ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    load_reg_var(s,(TCGv_i32)((long)ret - (long)s_00),reg);
    local_38 = ret;
    tcg_gen_callN_aarch64(s_00,helper_rbit_aarch64,ret,1,&local_38);
    store_reg(s,a->rd,(TCGv_i32)((long)ret - (long)s_00));
  }
  return SUB41(((uint)uVar1 & 0x40) >> 6,0);
}

Assistant:

static bool trans_RBIT(DisasContext *s, arg_rr *a)
{
    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    return op_rr(s, a, gen_helper_rbit);
}